

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cc
# Opt level: O2

double __thiscall fasttext::Args::getAutotuneMetricValue(Args *this)

{
  metric_name mVar1;
  float fVar2;
  double dVar3;
  string valueStr;
  
  mVar1 = getAutotuneMetric(this);
  dVar3 = 0.0;
  if (mVar1 - precisionAtRecall < 4) {
    std::__cxx11::string::find((char)&this->autotuneMetric,0x3a);
    std::__cxx11::string::substr((ulong)&valueStr,(ulong)&this->autotuneMetric);
    fVar2 = std::__cxx11::stof(&valueStr,(size_t *)0x0);
    dVar3 = (double)fVar2 / 100.0;
    std::__cxx11::string::~string((string *)&valueStr);
  }
  return dVar3;
}

Assistant:

double Args::getAutotuneMetricValue() const {
  metric_name metric = getAutotuneMetric();
  double value = 0.0;
  if (metric == metric_name::precisionAtRecallLabel ||
      metric == metric_name::precisionAtRecall ||
      metric == metric_name::recallAtPrecisionLabel ||
      metric == metric_name::recallAtPrecision) {
    size_t firstSemicolon = 18; // semicolon position in "precisionAtRecall:"
    size_t secondSemicolon = autotuneMetric.find(':', firstSemicolon);
    const std::string valueStr =
        autotuneMetric.substr(firstSemicolon, secondSemicolon - firstSemicolon);
    value = std::stof(valueStr) / 100.0;
  }
  return value;
}